

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

CBlock * blockencodings_tests::BuildBlockTestCase(FastRandomContext *ctx)

{
  uint256 hash;
  bool bVar1;
  reference pvVar2;
  CBlock *pCVar3;
  CBlock *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  CBlock *block;
  bool mutated;
  CMutableTransaction tx;
  CChainParams *in_stack_fffffffffffffdd8;
  CMutableTransaction *in_stack_fffffffffffffde0;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_fffffffffffffde8;
  size_type in_stack_fffffffffffffdf0;
  CBlock *in_stack_fffffffffffffdf8;
  Params *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  bool *in_stack_fffffffffffffe30;
  CBlock *block_00;
  undefined1 *puVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  CBlock *local_188;
  byte local_151;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [56];
  CChainParams *local_e8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  bool local_a8 [32];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(in_stack_fffffffffffffdf8);
  BuildTransactionTestCase();
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffde0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
  puVar7 = local_130;
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffde8,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffde0);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdd8);
  (in_RDI->super_CBlockHeader).nVersion = 0x2a;
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_18;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_10;
  *(undefined8 *)(in_RDI->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems =
       local_28;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_20;
  (in_RDI->super_CBlockHeader).nBits = 0x207fffff;
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffffdd8);
  uVar5 = 0;
  puVar6 = local_120;
  pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     (in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
  *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_38;
  *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_30;
  *(undefined8 *)(pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_48;
  *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_40;
  pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     (in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
  (pvVar2->prevout).n = 0;
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffde0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
  puVar4 = local_140;
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffde8,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffde0);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdd8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdf8,
             in_stack_fffffffffffffdf0);
  local_188 = (CBlock *)0x0;
  while (block_00 = local_188,
        pCVar3 = (CBlock *)
                 std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                           ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdd8),
        block_00 < pCVar3) {
    in_stack_fffffffffffffe30 = local_a8;
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffffdd8);
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       (in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
    *(undefined8 *)(pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_88
    ;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         local_80;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_78;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_70;
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       (in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
    (pvVar2->prevout).n = 0;
    local_188 = (CBlock *)((long)&(local_188->super_CBlockHeader).nVersion + 1);
  }
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffde0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffde8,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffde0);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdd8);
  BlockMerkleRoot(block_00,in_stack_fffffffffffffe30);
  *(undefined8 *)(in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems =
       local_c8;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
       local_c0;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_b8;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_b0;
  if (((local_151 ^ 0xff) & 1) != 0) {
    while( true ) {
      CBlockHeader::GetHash(&in_stack_fffffffffffffdf8->super_CBlockHeader);
      Params();
      CChainParams::GetConsensus(in_stack_fffffffffffffdd8);
      hash.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar5;
      hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((ulong)uVar5 >> 8);
      hash.super_base_blob<256U>.m_data._M_elems[10] = (char)((ulong)uVar5 >> 0x10);
      hash.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((ulong)uVar5 >> 0x18);
      hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)((ulong)uVar5 >> 0x20);
      hash.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((ulong)uVar5 >> 0x28);
      hash.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((ulong)uVar5 >> 0x30);
      hash.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((ulong)uVar5 >> 0x38);
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar4;
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ = puVar6;
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ = puVar7;
      in_stack_fffffffffffffdd8 = local_e8;
      bVar1 = CheckProofOfWork(hash,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe00);
      in_stack_fffffffffffffe0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe0c);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      (in_RDI->super_CBlockHeader).nNonce = (in_RDI->super_CBlockHeader).nNonce + 1;
    }
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffdd8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return in_RDI;
    }
    __stack_chk_fail();
  }
  __assert_fail("!mutated",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                ,0x35,"CBlock blockencodings_tests::BuildBlockTestCase(FastRandomContext &)");
}

Assistant:

static CBlock BuildBlockTestCase(FastRandomContext& ctx) {
    CBlock block;
    CMutableTransaction tx = BuildTransactionTestCase();

    block.vtx.resize(3);
    block.vtx[0] = MakeTransactionRef(tx);
    block.nVersion = 42;
    block.hashPrevBlock = ctx.rand256();
    block.nBits = 0x207fffff;

    tx.vin[0].prevout.hash = Txid::FromUint256(ctx.rand256());
    tx.vin[0].prevout.n = 0;
    block.vtx[1] = MakeTransactionRef(tx);

    tx.vin.resize(10);
    for (size_t i = 0; i < tx.vin.size(); i++) {
        tx.vin[i].prevout.hash = Txid::FromUint256(ctx.rand256());
        tx.vin[i].prevout.n = 0;
    }
    block.vtx[2] = MakeTransactionRef(tx);

    bool mutated;
    block.hashMerkleRoot = BlockMerkleRoot(block, &mutated);
    assert(!mutated);
    while (!CheckProofOfWork(block.GetHash(), block.nBits, Params().GetConsensus())) ++block.nNonce;
    return block;
}